

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzadmchunk.h
# Opt level: O0

void __thiscall
TPZAdmChunkVector<TPZGeoNode,_10>::Resize(TPZAdmChunkVector<TPZGeoNode,_10> *this,int newsize)

{
  int iVar1;
  ostream *this_00;
  int64_t iVar2;
  int64_t iVar3;
  int *piVar4;
  int in_ESI;
  long in_RDI;
  TPZChunkVector<TPZGeoNode,_10> *unaff_retaddr;
  int chunk;
  int index;
  TPZStack<int,_10> temp;
  int i;
  int chunksneeded;
  int nchunks;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  TPZStack<int,_10> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_18;
  
  if (in_ESI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "TPZAdmChunkVector::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else {
    TPZChunkVector<TPZGeoNode,_10>::Resize(unaff_retaddr,in_RDI);
    iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x88));
    iVar3 = TPZVec<TPZGeoNode_*>::NElements((TPZVec<TPZGeoNode_*> *)(in_RDI + 0x10));
    iVar1 = (int)iVar3;
    TPZManVector<int,_10>::Resize
              ((TPZManVector<int,_10> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    for (local_18 = (int)iVar2; local_18 < iVar1; local_18 = local_18 + 1) {
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x88),(long)local_18);
      *piVar4 = 0;
    }
    if (iVar1 <= (int)iVar2) {
      TPZStack<int,_10>::TPZStack
                (in_stack_ffffffffffffff60,
                 (TPZStack<int,_10> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
      ;
      TPZManVector<int,_10>::Resize
                ((TPZManVector<int,_10> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      while (iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0xd0)), 0 < iVar2) {
        in_stack_ffffffffffffff6c =
             TPZStack<int,_10>::Pop
                       ((TPZStack<int,_10> *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (in_stack_ffffffffffffff6c < in_ESI) {
          TPZStack<int,_10>::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        }
        else if (in_stack_ffffffffffffff6c >> 10 == iVar1 + -1) {
          in_stack_ffffffffffffff60 =
               (TPZStack<int,_10> *)
               TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x88),(long)(iVar1 + -1));
          *(int *)&(in_stack_ffffffffffffff60->super_TPZManVector<int,_10>).super_TPZVec<int>.
                   _vptr_TPZVec =
               *(int *)&(in_stack_ffffffffffffff60->super_TPZManVector<int,_10>).super_TPZVec<int>.
                        _vptr_TPZVec + -1;
        }
      }
      TPZStack<int,_10>::operator=
                (in_stack_ffffffffffffff60,
                 (TPZStack<int,_10> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
      ;
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x161996f);
    }
  }
  return;
}

Assistant:

void TPZAdmChunkVector<T, EXP>::Resize(const int newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TPZAdmChunkVector::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    TPZChunkVector<T, EXP>::Resize(newsize);

    //   int sizechunk = 1 << EXP;
    int nchunks = fNFree.NElements();
    int chunksneeded = this->fVec.NElements(); // equivalent to newsize>>fExponent??

    fNFree.Resize(chunksneeded);

    for (int i = nchunks; i < chunksneeded; i++) {
        fNFree[i] = 0;
    }

    if (chunksneeded > nchunks) return;

    // delete all free indexes which are above the new size
    // update the number of free elements of the last chunk
    TPZStack<int> temp(fFree);
    temp.Resize(0);

    while (fFree.NElements() > 0) {
        int index = fFree.Pop();
        if (index < newsize)
            temp.Push(index);
        else {
            int chunk = index >> EXP;

            if (chunk == chunksneeded - 1)
                fNFree[chunksneeded - 1]--;
        }
    }

    fFree = temp;
}